

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles3::Functional::Texture2DArrayFormatCase::testLayer
          (Texture2DArrayFormatCase *this,int layerNdx)

{
  int preferredHeight;
  RenderContext *context;
  undefined8 name;
  bool bVar1;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  undefined4 extraout_var_02;
  TextureFormat *pTVar7;
  long *plVar8;
  TextureFormat TVar9;
  long *plVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  byte bVar14;
  uint uVar15;
  RandomViewport viewport;
  vector<float,_std::allocator<float>_> texCoord;
  Surface renderedFrame;
  Surface referenceFrame;
  TextureFormatInfo spec;
  RandomViewport local_368;
  Texture2DArrayView local_358;
  long local_348;
  TextureFormat TStack_340;
  vector<float,_std::allocator<float>_> local_338;
  Surface local_320;
  long *local_308;
  long local_300;
  long local_2f8;
  long lStack_2f0;
  ulong local_2e8;
  TestLog *local_2e0;
  Surface local_2d8;
  long *local_2c0 [2];
  long local_2b0 [2];
  long *local_2a0 [2];
  long local_290 [2];
  ReferenceParams local_27c;
  PixelBufferAccess local_1e8 [2];
  ios_base local_178 [264];
  TextureFormatInfo local_70;
  long lVar5;
  undefined4 extraout_var_01;
  
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  local_2e0 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar2 = this->m_width;
  preferredHeight = this->m_height;
  dVar4 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&local_368,(RenderTarget *)CONCAT44(extraout_var_00,iVar3),iVar2,preferredHeight,dVar4)
  ;
  tcu::Surface::Surface(&local_320,local_368.width,local_368.height);
  tcu::Surface::Surface(&local_2d8,local_368.width,local_368.height);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  lVar6 = CONCAT44(extraout_var_01,iVar2);
  bVar14 = 8 - *(char *)(lVar6 + 8);
  uVar12 = 0;
  if (0 < *(int *)(lVar6 + 0x14)) {
    uVar12 = 0x1000000 << (8U - (char)*(int *)(lVar6 + 0x14) & 0x1f);
  }
  uVar13 = 0x100 << (8U - *(char *)(lVar6 + 0xc) & 0x1f) | 1 << (bVar14 & 0x1f);
  uVar12 = 0x10000 << (8U - *(char *)(lVar6 + 0x10) & 0x1f) | uVar13 | uVar12;
  uVar15 = 1 << (bVar14 & 0x1f) & 0xff;
  if (0xfd < uVar15) {
    uVar15 = 0xfe;
  }
  uVar13 = uVar13 >> 8 & 0xff;
  if (0xfd < uVar13) {
    uVar13 = 0xfe;
  }
  uVar11 = uVar12 >> 0x10 & 0xff;
  if (0xfd < uVar11) {
    uVar11 = 0xfe;
  }
  local_2e8 = (ulong)uVar11;
  uVar12 = uVar12 >> 0x18;
  if (0xfd < uVar12) {
    uVar12 = 0xfe;
  }
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&local_27c,TEXTURETYPE_2D_ARRAY);
  tcu::getTextureFormatInfo(&local_70,(TextureFormat *)&this->m_texture->m_refTexture);
  local_27c.super_RenderParams.samplerType =
       glu::TextureTestUtil::getSamplerType
                 ((this->m_texture->m_refTexture).super_TextureLevelPyramid.m_format);
  local_27c.sampler.wrapS = CLAMP_TO_EDGE;
  local_27c.sampler.wrapT = CLAMP_TO_EDGE;
  local_27c.sampler.wrapR = CLAMP_TO_EDGE;
  local_27c.sampler.minFilter = NEAREST;
  local_27c.sampler.magFilter = NEAREST;
  local_27c.sampler.lodThreshold = 0.0;
  local_27c.sampler.normalizedCoords = true;
  local_27c.sampler.compare = COMPAREMODE_NONE;
  local_27c.sampler.compareChannel = 0;
  local_27c.sampler.borderColor.v._0_8_ = 0;
  local_27c.sampler.borderColor.v._8_8_ = 0;
  local_27c.sampler.seamlessCubeMap = false;
  local_27c.sampler._53_3_ = 0;
  local_27c.sampler.depthStencilMode = MODE_DEPTH;
  local_27c.super_RenderParams.colorScale.m_data[0] = local_70.lookupScale.m_data[0];
  local_27c.super_RenderParams.colorScale.m_data[1] = local_70.lookupScale.m_data[1];
  local_27c.super_RenderParams.colorScale.m_data[2] = local_70.lookupScale.m_data[2];
  local_27c.super_RenderParams.colorScale.m_data[3] = local_70.lookupScale.m_data[3];
  local_27c.super_RenderParams.colorBias.m_data[0] = local_70.lookupBias.m_data[0];
  local_27c.super_RenderParams.colorBias.m_data[1] = local_70.lookupBias.m_data[1];
  local_27c.super_RenderParams.colorBias.m_data[2] = local_70.lookupBias.m_data[2];
  local_27c.super_RenderParams.colorBias.m_data[3] = local_70.lookupBias.m_data[3];
  local_1e8[0].super_ConstPixelBufferAccess.m_format.order = R;
  local_1e8[0].super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
  local_358._0_8_ = &DAT_3f8000003f800000;
  glu::TextureTestUtil::computeQuadTexCoord2DArray
            (&local_338,layerNdx,(Vec2 *)local_1e8,(Vec2 *)&local_358);
  (**(code **)(lVar5 + 0x1a00))(local_368.x,local_368.y,local_368.width,local_368.height);
  glu::Texture2DArray::upload(this->m_texture);
  (**(code **)(lVar5 + 8))(0x84c0);
  (**(code **)(lVar5 + 0xb8))(0x8c1a,this->m_texture->m_glTexture);
  (**(code **)(lVar5 + 0x1360))(0x8c1a,0x2802,0x812f);
  (**(code **)(lVar5 + 0x1360))(0x8c1a,0x2803,0x812f);
  (**(code **)(lVar5 + 0x1360))(0x8c1a,0x2801,0x2600);
  (**(code **)(lVar5 + 0x1360))(0x8c1a,0x2800,0x2600);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureFormatTests.cpp"
                  ,0x21d);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,
             local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&local_27c.super_RenderParams);
  context = this->m_renderCtx;
  local_358.m_numLevels = RGBA;
  local_358._4_4_ = UNORM_INT8;
  if ((void *)local_320.m_pixels.m_cap != (void *)0x0) {
    local_320.m_pixels.m_cap = (size_t)local_320.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            (local_1e8,(TextureFormat *)&local_358,local_320.m_width,local_320.m_height,1,
             (void *)local_320.m_pixels.m_cap);
  glu::readPixels(context,local_368.x,local_368.y,local_1e8);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  tcu::SurfaceAccess::SurfaceAccess
            ((SurfaceAccess *)local_1e8,&local_2d8,
             (PixelFormat *)(CONCAT44(extraout_var_02,iVar2) + 8));
  local_358.m_levels = (this->m_texture->m_refTexture).m_view.m_levels;
  local_358.m_numLevels = (this->m_texture->m_refTexture).m_view.m_numLevels;
  glu::TextureTestUtil::sampleTexture
            ((SurfaceAccess *)local_1e8,&local_358,
             local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,&local_27c);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
  std::ostream::operator<<(local_1e8,layerNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  std::ios_base::~ios_base(local_178);
  pTVar7 = (TextureFormat *)std::__cxx11::string::replace((ulong)local_2a0,0,(char *)0x0,0x1c7f338);
  TVar9 = (TextureFormat)(pTVar7 + 2);
  if (*pTVar7 == TVar9) {
    local_348 = *(long *)TVar9;
    TStack_340 = pTVar7[3];
    local_358._0_8_ = &local_348;
  }
  else {
    local_348 = *(long *)TVar9;
    local_358._0_8_ = *pTVar7;
  }
  name = local_358._0_8_;
  local_358.m_levels = *(ConstPixelBufferAccess **)(pTVar7 + 1);
  *pTVar7 = TVar9;
  pTVar7[1].order = R;
  pTVar7[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar7[2].order = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
  std::ostream::operator<<(local_1e8,layerNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
  std::ios_base::~ios_base(local_178);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)local_2c0,0,(char *)0x0,0x1cd4a46);
  plVar10 = plVar8 + 2;
  if ((long *)*plVar8 == plVar10) {
    local_2f8 = *plVar10;
    lStack_2f0 = plVar8[3];
    local_308 = &local_2f8;
  }
  else {
    local_2f8 = *plVar10;
    local_308 = (long *)*plVar8;
  }
  local_300 = plVar8[1];
  *plVar8 = (long)plVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  bVar1 = glu::TextureTestUtil::compareImages
                    (local_2e0,(char *)name,(char *)local_308,&local_2d8,&local_320,
                     (RGBA)(uVar12 * 0x1000000 + ((int)local_2e8 << 0x10 | uVar13 * 0x100 + uVar15)
                           + 0x1010101));
  if (local_308 != &local_2f8) {
    operator_delete(local_308,local_2f8 + 1);
  }
  if (local_2c0[0] != local_2b0) {
    operator_delete(local_2c0[0],local_2b0[0] + 1);
  }
  if ((long *)local_358._0_8_ != &local_348) {
    operator_delete((void *)local_358._0_8_,local_348 + 1);
  }
  if (local_2a0[0] != local_290) {
    operator_delete(local_2a0[0],local_290[0] + 1);
  }
  if (local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_2d8);
  tcu::Surface::~Surface(&local_320);
  return bVar1;
}

Assistant:

bool Texture2DArrayFormatCase::testLayer (int layerNdx)
{
	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	TestLog&				log					= m_testCtx.getLog();
	RandomViewport			viewport			(m_renderCtx.getRenderTarget(), m_width, m_height, deStringHash(getName()));
	tcu::Surface			renderedFrame		(viewport.width, viewport.height);
	tcu::Surface			referenceFrame		(viewport.width, viewport.height);
	tcu::RGBA				threshold			= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
	vector<float>			texCoord;
	ReferenceParams			renderParams		(TEXTURETYPE_2D_ARRAY);
	tcu::TextureFormatInfo	spec				= tcu::getTextureFormatInfo(m_texture->getRefTexture().getFormat());

	renderParams.samplerType	= getSamplerType(m_texture->getRefTexture().getFormat());
	renderParams.sampler		= Sampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST, Sampler::NEAREST);
	renderParams.colorScale		= spec.lookupScale;
	renderParams.colorBias		= spec.lookupBias;

	computeQuadTexCoord2DArray(texCoord, layerNdx, tcu::Vec2(0.0f, 0.0f), tcu::Vec2(1.0f, 1.0f));

	// Setup base viewport.
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Upload texture data to GL.
	m_texture->upload();

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_2D_ARRAY, m_texture->getGLTexture());

	// Setup nearest neighbor filtering and clamp-to-edge.
	gl.texParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	// Draw.
	m_renderer.renderQuad(0, &texCoord[0], renderParams);
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());

	// Compute reference.
	sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat()), m_texture->getRefTexture(), &texCoord[0], renderParams);

	// Compare and log.
	return compareImages(log, (string("Layer" + de::toString(layerNdx))).c_str(), (string("Layer " + de::toString(layerNdx))).c_str(), referenceFrame, renderedFrame, threshold);
}